

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

SRunner * srunner_create(Suite *s)

{
  SRunner *pSVar1;
  List *pLVar2;
  TestStats *pTVar3;
  
  pSVar1 = (SRunner *)emalloc(0x40);
  pLVar2 = check_list_create();
  pSVar1->slst = pLVar2;
  if (s != (Suite *)0x0) {
    check_list_add_end(pLVar2,s);
  }
  pTVar3 = (TestStats *)emalloc(0xc);
  pSVar1->stats = pTVar3;
  pTVar3->n_errors = 0;
  pTVar3->n_checked = 0;
  pTVar3->n_failed = 0;
  pLVar2 = check_list_create();
  pSVar1->resultlst = pLVar2;
  pSVar1->log_fname = (char *)0x0;
  pSVar1->xml_fname = (char *)0x0;
  pSVar1->tap_fname = (char *)0x0;
  pSVar1->loglst = (List *)0x0;
  pSVar1->fstat = CK_FORK_GETENV;
  return pSVar1;
}

Assistant:

SRunner *srunner_create(Suite * s)
{
    SRunner *sr = (SRunner *)emalloc(sizeof(SRunner));     /* freed in srunner_free */

    sr->slst = check_list_create();
    if(s != NULL)
        check_list_add_end(sr->slst, s);
    sr->stats = (TestStats *)emalloc(sizeof(TestStats));     /* freed in srunner_free */
    sr->stats->n_checked = sr->stats->n_failed = sr->stats->n_errors = 0;
    sr->resultlst = check_list_create();
    sr->log_fname = NULL;
    sr->xml_fname = NULL;
    sr->tap_fname = NULL;
    sr->loglst = NULL;

#if defined(HAVE_FORK)
    sr->fstat = CK_FORK_GETENV;
#else
    /*
     * Overriding the default of running tests in fork mode,
     * as this system does not have fork()
     */
    sr->fstat = CK_NOFORK;
#endif /* HAVE_FORK */

    return sr;
}